

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

basic_node_ptr<unodb::detail::olc_node_header> __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::leave_last_child(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   *this,uint8_t child_to_delete,db_type *db_instance)

{
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *poVar1;
  bool bVar2;
  node_type nVar3;
  byte prefix2;
  reference pvVar4;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_00;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_01;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *prefix1;
  in_critical_section *this_02;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_to_leave_ptr;
  basic_node_ptr<unodb::detail::olc_node_header> child_to_leave_ptr;
  undefined1 local_48 [7];
  uint8_t child_to_leave;
  leaf_reclaimable_ptr r;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *child_to_delete_ptr;
  db_type *db_instance_local;
  uint8_t child_to_delete_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  bVar2 = basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::is_min_size((basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                         *)this);
  if (!bVar2) {
    __assert_fail("this->is_min_size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x59f,
                  "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::leave_last_child(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (1 < child_to_delete) {
    __assert_fail("child_to_delete == 0 || child_to_delete == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x5a1,
                  "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::leave_last_child(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pvVar4 = std::
           array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
           ::operator[](&this->children,(ulong)child_to_delete);
  r._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl =
       (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
       in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                 (pvVar4);
  leaf = basic_node_ptr<unodb::detail::olc_node_header>::
         ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                   ((basic_node_ptr<unodb::detail::olc_node_header> *)
                    &r._M_t.
                     super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     .
                     super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                   );
  basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
  ::reclaim_leaf_on_scope_exit
            ((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
              *)local_48,leaf,db_instance);
  child_to_leave_ptr.tagged_ptr._7_1_ = child_to_delete == '\0';
  pvVar4 = std::
           array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
           ::operator[](&this->children,(ulong)child_to_leave_ptr.tagged_ptr._7_1_);
  inode_to_leave_ptr =
       (olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
       in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                 (pvVar4);
  nVar3 = basic_node_ptr<unodb::detail::olc_node_header>::type
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)&inode_to_leave_ptr);
  if (nVar3 != LEAF) {
    this_00 = &basic_node_ptr<unodb::detail::olc_node_header>::
               ptr<unodb::detail::olc_inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                         ((basic_node_ptr<unodb::detail::olc_node_header> *)&inode_to_leave_ptr)->
               super_olc_inode_base<unsigned_long,_std::span<const_std::byte>_>;
    this_01 = basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::get_key_prefix(this_00);
    prefix1 = basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this);
    this_02 = (in_critical_section *)
              std::array<unodb::in_critical_section<std::byte>,_4UL>::operator[]
                        (&(this->keys).byte_array,(ulong)child_to_leave_ptr.tagged_ptr._7_1_);
    prefix2 = in_critical_section::operator_cast_to_byte(this_02);
    key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
    ::prepend((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
               *)&this_01->f,prefix1,prefix2);
  }
  poVar1 = inode_to_leave_ptr;
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_48);
  return (basic_node_ptr<unodb::detail::olc_node_header>)(uintptr_t)poVar1;
}

Assistant:

[[nodiscard]] constexpr auto leave_last_child(std::uint8_t child_to_delete,
                                                db_type &db_instance) noexcept {
    UNODB_DETAIL_ASSERT(this->is_min_size());
    // NOLINTNEXTLINE(readability-simplify-boolean-expr)
    UNODB_DETAIL_ASSERT(child_to_delete == 0 || child_to_delete == 1);

    auto *const child_to_delete_ptr{
        children[child_to_delete].load().template ptr<leaf_type *>()};
    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(child_to_delete_ptr,
                                                       db_instance)};

    const std::uint8_t child_to_leave = (child_to_delete == 0) ? 1U : 0U;
    const auto child_to_leave_ptr = children[child_to_leave].load();
    if (child_to_leave_ptr.type() != node_type::LEAF) {
      auto *const inode_to_leave_ptr{
          child_to_leave_ptr.template ptr<inode_type *>()};
      inode_to_leave_ptr->get_key_prefix().prepend(
          this->get_key_prefix(), keys.byte_array[child_to_leave]);
    }
    return child_to_leave_ptr;
  }